

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void TableSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiTable *pIVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  
  if ((ctx->Tables).Map.Data.Size != 0) {
    lVar2 = 8;
    uVar3 = 0;
    do {
      pIVar1 = (ctx->Tables).Buf.Data;
      lVar4 = (long)*(int *)((long)&((ctx->Tables).Map.Data.Data)->key + lVar2);
      if (pIVar1 != (ImGuiTable *)0x0 && lVar4 != -1) {
        pIVar1[lVar4].IsSettingsRequestLoad = true;
        pIVar1[lVar4].SettingsOffset = -1;
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 != (uint)(ctx->Tables).Map.Data.Size);
  }
  return;
}

Assistant:

static void TableSettingsHandler_ApplyAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetMapSize(); i++)
        if (ImGuiTable* table = g.Tables.TryGetMapData(i))
        {
            table->IsSettingsRequestLoad = true;
            table->SettingsOffset = -1;
        }
}